

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigNumber.cpp
# Opt level: O0

BigNumber * __thiscall BigNumber::operator-(BigNumber *__return_storage_ptr__,BigNumber *this)

{
  int8_t *piVar1;
  ulong local_38;
  size_t i;
  BigNumber *this_local;
  BigNumber *temp;
  
  BigNumber(__return_storage_ptr__);
  __return_storage_ptr__->sign = (bool)(~this->sign & 1);
  __return_storage_ptr__->numOfDigits = this->numOfDigits;
  piVar1 = (int8_t *)operator_new__((ulong)this->numOfDigits);
  __return_storage_ptr__->numArray = piVar1;
  for (local_38 = 0; local_38 < this->numOfDigits; local_38 = local_38 + 1) {
    __return_storage_ptr__->numArray[local_38] = this->numArray[local_38];
  }
  return __return_storage_ptr__;
}

Assistant:

BigNumber BigNumber:: operator-() const{    //gharine kardan bigNumber
    BigNumber temp;
    temp.sign = !sign;
    temp.numOfDigits = numOfDigits;
    temp.numArray = new int8_t[numOfDigits];
    for( size_t i{0}; i < numOfDigits; ++i){
        temp.numArray[i] = numArray[i];
    }
    return temp;
}